

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_filter.hpp
# Opt level: O0

bool __thiscall
jsoncons::
json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
::visit_key(json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
            *this,string_view_type *name,ser_context *context,error_code *ec)

{
  byte bVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *target_00;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *context_00;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  string_view_type *in_RDI;
  type tVar2;
  type result;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> target;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  wstring *this_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  wstring local_40 [48];
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  
  this_00 = local_40;
  local_10 = in_RSI;
  std::__cxx11::wstring::wstring(this_00);
  target_00 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
              std::basic_string_view<char,_std::char_traits<char>_>::data(local_10);
  std::basic_string_view<char,_std::char_traits<char>_>::size(local_10);
  tVar2 = unicode_traits::convert<char,std::__cxx11::wstring>
                    ((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (size_t)this_00,target_00,(conv_flags)((ulong)in_RDI >> 0x20));
  if (tVar2.ec != success) {
    std::error_code::operator=((error_code *)target_00,(conv_errc)((ulong)in_RDI >> 0x20));
  }
  context_00 = json_visitor_adaptor_base<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>_>
               ::destination((json_visitor_adaptor_base<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>_>
                              *)in_RDI);
  std::__cxx11::wstring::operator_cast_to_basic_string_view(local_40);
  bVar1 = basic_json_visitor<wchar_t>::key
                    ((basic_json_visitor<wchar_t> *)target_00,in_RDI,(ser_context *)context_00,
                     (error_code *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  std::__cxx11::wstring::~wstring(local_40);
  return (bool)(bVar1 & 1);
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name,
        const ser_context& context,
        std::error_code& ec) override
    {
        std::basic_string<typename To::char_type> target;
        auto result = unicode_traits::convert(name.data(), name.size(), target, unicode_traits::conv_flags::strict);
        if (result.ec != unicode_traits::conv_errc())
        {
            ec = result.ec;
        }
        return destination().key(target, context, ec);
    }